

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O3

string * hmac_hash::sha1(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  size_t i;
  long lVar2;
  char *__s;
  size_type __dnew;
  uint8_t digest [20];
  char buf [41];
  size_type local_b0;
  byte local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined1 uStack_70;
  undefined7 local_6f;
  undefined1 uStack_68;
  undefined7 uStack_67;
  undefined1 uStack_60;
  SHA1 local_58;
  
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_h[0] = 0x67452301;
  local_58.m_h[1] = 0xefcdab89;
  local_58.m_h[2] = 0x98badcfe;
  local_58.m_h[3] = 0x10325476;
  local_58.m_h[4] = 0xc3d2e1f0;
  local_58.m_transforms = 0;
  SHA1::update(&local_58,(uchar *)(input->_M_dataplus)._M_p,input->_M_string_length);
  SHA1::finish(&local_58,local_a8);
  __s = (char *)&local_88;
  uStack_68 = 0;
  uStack_67 = 0;
  uStack_60 = 0;
  uStack_78 = 0;
  uStack_70 = 0;
  local_6f = 0;
  local_88 = 0;
  uStack_80 = 0;
  lVar2 = 0;
  do {
    sprintf(__s,"%02x",(ulong)local_a8[lVar2]);
    lVar2 = lVar2 + 1;
    __s = __s + 2;
  } while (lVar2 != 0x14);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_b0 = 0x28;
  pcVar1 = (pointer)std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b0;
  *(ulong *)(pcVar1 + 0x20) = CONCAT71(uStack_67,uStack_68);
  *(undefined8 *)(pcVar1 + 0x10) = uStack_78;
  *(ulong *)(pcVar1 + 0x18) = CONCAT71(local_6f,uStack_70);
  *(undefined8 *)pcVar1 = local_88;
  *(undefined8 *)(pcVar1 + 8) = uStack_80;
  __return_storage_ptr__->_M_string_length = local_b0;
  pcVar1[local_b0] = '\0';
  if (local_58.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string sha1(const std::string &input) {
        uint8_t digest[hmac_hash::SHA1::DIGEST_SIZE];
        std::fill(digest, digest + hmac_hash::SHA1::DIGEST_SIZE, '\0');

        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update((uint8_t*)input.c_str(), input.length());
        ctx.finish(digest);

        char buf[2 * hmac_hash::SHA1::DIGEST_SIZE + 1];
        std::fill(buf, buf + (2 * hmac_hash::SHA1::DIGEST_SIZE + 1), '\0');
        for(size_t i = 0; i < hmac_hash::SHA1::DIGEST_SIZE; ++i) {
            sprintf(buf + i * 2, "%02x", digest[i]);
        }
        return std::string(buf, (2 * hmac_hash::SHA1::DIGEST_SIZE));
    }